

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_bit_is_set(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                    lys_module *param_4,lyxp_set *set,int options)

{
  lyxp_set *set_00;
  lyd_node *plVar1;
  int iVar2;
  int iVar3;
  lys_node *plVar4;
  char *pcVar5;
  char *pcVar6;
  ly_ctx *plVar7;
  ulong uVar8;
  ulong uVar9;
  
  set_00 = *args;
  if ((options & 0x1cU) == 0) {
    if (set_00->type < LYXP_SET_SNODE_SET) {
      iVar3 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar3 == 0) {
        set_fill_boolean(set,0);
        if ((*args)->type != LYXP_SET_NODE_SET) {
          return 0;
        }
        plVar1 = (((*args)->val).nodes)->node;
        plVar4 = plVar1->schema;
        if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          return 0;
        }
        if (*(int *)&plVar4[1].ref != 2) {
          return 0;
        }
        uVar9 = (ulong)plVar4[1].nodetype;
        if ((int)plVar4[1].nodetype < 1) {
          uVar9 = 0;
        }
        uVar8 = 0;
        while( true ) {
          if (uVar9 == uVar8) {
            return 0;
          }
          plVar4 = (&plVar1->child->schema)[uVar8];
          if ((plVar4 != (lys_node *)0x0) &&
             (iVar3 = ly_strequal_(plVar4->name,(args[1]->val).str), iVar3 != 0)) break;
          uVar8 = uVar8 + 1;
        }
        set_fill_boolean(set,1);
        return 0;
      }
    }
    else {
      plVar7 = param_4->ctx;
      pcVar5 = print_set_type(set_00);
      ly_vlog(plVar7,LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar5,
              "bit-is-set(node-set, string)");
    }
    return -1;
  }
  if ((set_00->type == LYXP_SET_SNODE_SET) &&
     (plVar4 = warn_get_snode_in_ctx(set_00), plVar4 != (lys_node *)0x0)) {
    if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar7 = param_4->ctx;
      pcVar5 = strnodetype(plVar4->nodetype);
      pcVar6 = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      iVar2 = warn_is_specific_type((lys_type *)&plVar4[1].ref,LY_TYPE_BITS);
      iVar3 = 0;
      if (iVar2 != 0) goto LAB_001790bb;
      plVar7 = param_4->ctx;
      pcVar5 = plVar4->name;
      pcVar6 = "Argument #1 of %s is node \"%s\", not of type \"bits\".";
    }
    iVar3 = 1;
    ly_log(plVar7,LY_LLWRN,LY_SUCCESS,pcVar6,"xpath_bit_is_set",pcVar5);
  }
  else {
    iVar3 = 1;
    ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
           "xpath_bit_is_set");
  }
LAB_001790bb:
  if ((args[1]->type == LYXP_SET_SNODE_SET) &&
     (plVar4 = warn_get_snode_in_ctx(args[1]), plVar4 != (lys_node *)0x0)) {
    if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar7 = param_4->ctx;
      pcVar5 = strnodetype(plVar4->nodetype);
      pcVar6 = "Argument #2 of %s is a %s node \"%s\".";
    }
    else {
      iVar2 = warn_is_string_type((lys_type *)&plVar4[1].ref);
      if (iVar2 != 0) goto LAB_0017913e;
      plVar7 = param_4->ctx;
      pcVar5 = plVar4->name;
      pcVar6 = "Argument #2 of %s is node \"%s\", not of string-type.";
    }
    iVar3 = 1;
    ly_log(plVar7,LY_LLWRN,LY_SUCCESS,pcVar6,"xpath_bit_is_set",pcVar5);
  }
LAB_0017913e:
  set_snode_clear_ctx(set);
  return iVar3;
}

Assistant:

static int
xpath_bit_is_set(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                 struct lyxp_set *set, int options)
{
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;
    int i, bits_count, ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_BITS)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"bits\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "bit-is-set(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type == LYXP_SET_NODE_SET) {
        leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[0].node;
        if ((leaf->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))
                && (((struct lys_node_leaf *)leaf->schema)->type.base == LY_TYPE_BITS)) {
            bits_count = ((struct lys_node_leaf *)leaf->schema)->type.info.bits.count;
            for (i = 0; i < bits_count; ++i) {
                if (leaf->value.bit[i] && ly_strequal(leaf->value.bit[i]->name, args[1]->val.str, 0)) {
                    set_fill_boolean(set, 1);
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}